

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int __thiscall CTPNSymBase::check_lvalue_resolved(CTPNSymBase *this,CTcPrsSymtab *symtab)

{
  CTcSymbol *pCVar1;
  CTcPrsSymtab *in_RSI;
  long *in_RDI;
  CTcSymbol *sym;
  int local_4;
  
  (**(code **)(*in_RDI + 0x60))();
  (**(code **)(*in_RDI + 0x68))();
  pCVar1 = CTcPrsSymtab::find(in_RSI,(textchar_t *)in_RDI,0x25afe8);
  if (pCVar1 == (CTcSymbol *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = (*(pCVar1->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
                _vptr_CVmHashEntry[5])();
  }
  return local_4;
}

Assistant:

int CTPNSymBase::check_lvalue_resolved(class CTcPrsSymtab *symtab) const
{
    CTcSymbol *sym;

    /* look up the symbol in the given scope */
    sym = symtab->find(get_sym_text(), get_sym_text_len());
    if (sym != 0)
    {
        /* ask the symbol what it thinks */
        return sym->check_lvalue();
    }
    else
    {
        /* it's undefined - can't be an lvalue */
        return FALSE;
    }
}